

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborarray.cpp
# Opt level: O0

void __thiscall QCborArray::removeAt(QCborArray *this,qsizetype i)

{
  QCborArray *in_RSI;
  qsizetype in_RDI;
  QCborArray *unaff_retaddr;
  qsizetype in_stack_00000018;
  QCborContainerPrivate *in_stack_00000020;
  
  size(in_RSI);
  detach(unaff_retaddr,in_RDI);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::operator->
            ((QExplicitlySharedDataPointer<QCborContainerPrivate> *)0x476135);
  QCborContainerPrivate::removeAt(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void QCborArray::removeAt(qsizetype i)
{
    detach(size());
    d->removeAt(i);
}